

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varlist.cc
# Opt level: O0

void __thiscall VariableList::InitFunctions(VariableList *this)

{
  allocator local_d61;
  string local_d60 [39];
  allocator local_d39;
  string local_d38 [39];
  allocator local_d11;
  string local_d10 [39];
  allocator local_ce9;
  string local_ce8 [39];
  allocator local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [39];
  allocator local_c71;
  string local_c70 [39];
  allocator local_c49;
  string local_c48 [39];
  allocator local_c21;
  string local_c20 [39];
  allocator local_bf9;
  string local_bf8 [39];
  allocator local_bd1;
  string local_bd0 [39];
  allocator local_ba9;
  string local_ba8 [39];
  allocator local_b81;
  string local_b80 [39];
  allocator local_b59;
  string local_b58 [39];
  allocator local_b31;
  string local_b30 [39];
  allocator local_b09;
  string local_b08 [39];
  allocator local_ae1;
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [39];
  allocator local_a91;
  string local_a90 [39];
  allocator local_a69;
  string local_a68 [39];
  allocator local_a41;
  string local_a40 [39];
  allocator local_a19;
  string local_a18 [39];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [39];
  allocator local_9a1;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [39];
  allocator local_929;
  string local_928 [39];
  allocator local_901;
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [39];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [39];
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [39];
  allocator local_771;
  string local_770 [39];
  allocator local_749;
  string local_748 [39];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [39];
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  VariableList *local_10;
  VariableList *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"ABS",&local_31);
  InitOneFunction(this,(string *)local_30,"fabs",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"ABS%",&local_69);
  InitOneFunction(this,(string *)local_68,"abs",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"ASC",&local_91);
  InitOneFunction(this,(string *)local_90,"basic::Ascii",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"ASCII",&local_b9);
  InitOneFunction(this,(string *)local_b8,"basic::Ascii",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"ATN",&local_e1);
  InitOneFunction(this,(string *)local_e0,"atan",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"BUFSIZ",&local_109);
  InitOneFunction(this,(string *)local_108,"basic::Bufsiz",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"CCPOS",&local_131);
  InitOneFunction(this,(string *)local_130,"basic::Ccpos",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"CHR$",&local_159);
  InitOneFunction(this,(string *)local_158,"basic::Char",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"COMP%",&local_181);
  InitOneFunction(this,(string *)local_180,"basic::Comp",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"COS",&local_1a9);
  InitOneFunction(this,(string *)local_1a8,"cos",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"CTRLC",&local_1d1);
  InitOneFunction(this,(string *)local_1d0,"basic::ctrlc()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"CVT$%",&local_1f9);
  InitOneFunction(this,(string *)local_1f8,"basic::cvtai",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"CVT%$",&local_221);
  InitOneFunction(this,(string *)local_220,"basic::cvtia",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"CVT$F",&local_249);
  InitOneFunction(this,(string *)local_248,"basic::cvtaf",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"CVTF$",&local_271);
  InitOneFunction(this,(string *)local_270,"basic::cvtfa",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"CVT$$",&local_299);
  InitOneFunction(this,(string *)local_298,"basic::edit",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"DATE$",&local_2c1);
  InitOneFunction(this,(string *)local_2c0,"basic::Qdate",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"DET",&local_2e9);
  InitOneFunction(this,(string *)local_2e8,"basic::det()",VARTYPE_DOUBLE,VARCLASS_NONE);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"DIF$",&local_311);
  InitOneFunction(this,(string *)local_310,"basic::Dif",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"ECHO",&local_339);
  InitOneFunction(this,(string *)local_338,"basic::Echo",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"EDIT$",&local_361);
  InitOneFunction(this,(string *)local_360,"basic::edit",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"ERR",&local_389);
  InitOneFunction(this,(string *)local_388,"Be.err",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"ERL",&local_3b1);
  InitOneFunction(this,(string *)local_3b0,"Be.erl",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"ERN$",&local_3d9);
  InitOneFunction(this,(string *)local_3d8,"Be.ern",VARTYPE_DYNSTR,VARCLASS_NONE);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"ERT$",&local_401);
  InitOneFunction(this,(string *)local_400,"basic::ert",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"EXP",&local_429);
  InitOneFunction(this,(string *)local_428,"basic::exp",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"FIX",&local_451);
  InitOneFunction(this,(string *)local_450,"trunc",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"FORMAT$",&local_479);
  InitOneFunction(this,(string *)local_478,"basic::Format",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"FSP$",&local_4a1);
  InitOneFunction(this,(string *)local_4a0,"basic::Fsp",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"FSS$",&local_4c9);
  InitOneFunction(this,(string *)local_4c8,"basic::Fss",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"GETRFA",&local_4f1);
  InitOneFunction(this,(string *)local_4f0,"basic::Getrfa",VARTYPE_RFA,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"INKEY$",&local_519);
  InitOneFunction(this,(string *)local_518,"basic::Inkey",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"INSTR",&local_541);
  InitOneFunction(this,(string *)local_540,"basic::instr",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"INT",&local_569);
  InitOneFunction(this,(string *)local_568,"floor",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"LEFT",&local_591);
  InitOneFunction(this,(string *)local_590,"basic::left",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"LEFT$",&local_5b9);
  InitOneFunction(this,(string *)local_5b8,"basic::left",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"LEN",&local_5e1);
  InitOneFunction(this,(string *)local_5e0,"basic::strlen",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"LOC",&local_609);
  InitOneFunction(this,(string *)local_608,"&",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"LOG",&local_631);
  InitOneFunction(this,(string *)local_630,"log",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"LOG10",&local_659);
  InitOneFunction(this,(string *)local_658,"log10",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_680,"MAG",&local_681);
  InitOneFunction(this,(string *)local_680,"basic::Mag",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"MAGTAPE",&local_6a9);
  InitOneFunction(this,(string *)local_6a8,"basic::Magtape",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"MAR",&local_6d1);
  InitOneFunction(this,(string *)local_6d0,"basic::Mar",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"MID",&local_6f9);
  InitOneFunction(this,(string *)local_6f8,"basic::mid",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"MID$",&local_721);
  InitOneFunction(this,(string *)local_720,"basic::mid",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,"NOECHO",&local_749);
  InitOneFunction(this,(string *)local_748,"basic::NoEcho",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"NUM",&local_771);
  InitOneFunction(this,(string *)local_770,"basic::num()",VARTYPE_DOUBLE,VARCLASS_NONE);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"NUM2",&local_799);
  InitOneFunction(this,(string *)local_798,"basic::num2()",VARTYPE_DOUBLE,VARCLASS_NONE);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"NUM$",&local_7c1);
  InitOneFunction(this,(string *)local_7c0,"basic::Qnum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8,"NUM1$",&local_7e9);
  InitOneFunction(this,(string *)local_7e8,"std::to_string",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"ONECHR",&local_811);
  InitOneFunction(this,(string *)local_810,"basic::OneChr",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"PLACE$",&local_839);
  InitOneFunction(this,(string *)local_838,"basic::Place",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"POS",&local_861);
  InitOneFunction(this,(string *)local_860,"basic::Ccpos",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_888,"PROD$",&local_889);
  InitOneFunction(this,(string *)local_888,"basic::Prod",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"QUO$",&local_8b1);
  InitOneFunction(this,(string *)local_8b0,"basic::Quo",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,"RAD$",&local_8d9);
  InitOneFunction(this,(string *)local_8d8,"basic::Qrad",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_900,"RCTLC",&local_901);
  InitOneFunction(this,(string *)local_900,"basic::rctlc()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_928,"RCTLO",&local_929);
  InitOneFunction(this,(string *)local_928,"basic::rctlo()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_950,"RECOUNT",&local_951);
  InitOneFunction(this,(string *)local_950,"basic::recount()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"RIGHT",&local_979);
  InitOneFunction(this,(string *)local_978,"basic::right",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a0,"RIGHT$",&local_9a1);
  InitOneFunction(this,(string *)local_9a0,"basic::right",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"RND",&local_9c9);
  InitOneFunction(this,(string *)local_9c8,"basic::floatrand",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"RND",&local_9f1);
  InitOneFunction(this,(string *)local_9f0,"basic::floatrand()",VARTYPE_DOUBLE,VARCLASS_NONE);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a18,"SEG$",&local_a19);
  InitOneFunction(this,(string *)local_a18,"basic::Qseg",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator((allocator<char> *)&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a40,"SGN",&local_a41);
  InitOneFunction(this,(string *)local_a40,"basic::sgn",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a68,"SIN",&local_a69);
  InitOneFunction(this,(string *)local_a68,"sin",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a90,"SPACE$",&local_a91);
  InitOneFunction(this,(string *)local_a90,"basic::Qspace",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab8,"SQRT",&local_ab9);
  InitOneFunction(this,(string *)local_ab8,"sqrt",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae0,"SQR",&local_ae1);
  InitOneFunction(this,(string *)local_ae0,"sqrt",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b08,"STATUS",&local_b09);
  InitOneFunction(this,(string *)local_b08,"basic::status()",VARTYPE_LONG,VARCLASS_NONE);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b30,"STR$",&local_b31);
  InitOneFunction(this,(string *)local_b30,"basic::Qnum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b58,"STRING$",&local_b59);
  InitOneFunction(this,(string *)local_b58,"basic::Qstring",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator((allocator<char> *)&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b80,"STR$FIND_FIRST_IN_SET",&local_b81);
  InitOneFunction(this,(string *)local_b80,"str$find_first_in_set",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba8,"SUM$",&local_ba9);
  InitOneFunction(this,(string *)local_ba8,"basic::Sum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_ba8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd0,"SWAP%",&local_bd1);
  InitOneFunction(this,(string *)local_bd0,"basic::Swap",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf8,"SYS",&local_bf9);
  InitOneFunction(this,(string *)local_bf8,"basic::sys",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c20,"TAB",&local_c21);
  InitOneFunction(this,(string *)local_c20,"Tab",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c48,"TAN",&local_c49);
  InitOneFunction(this,(string *)local_c48,"tan",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c70,"TIME",&local_c71);
  InitOneFunction(this,(string *)local_c70,"basic::Time",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c98,"TIME$",&local_c99);
  InitOneFunction(this,(string *)local_c98,"basic::Qtime",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc0,"TRM$",&local_cc1);
  InitOneFunction(this,(string *)local_cc0,"boost::trim_right_copy",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce8,"VAL",&local_ce9);
  InitOneFunction(this,(string *)local_ce8,"std::stod",VARTYPE_DOUBLE,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d10,"VAL%",&local_d11);
  InitOneFunction(this,(string *)local_d10,"std::stol",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d38,"XLATE",&local_d39);
  InitOneFunction(this,(string *)local_d38,"basic::Xlate",VARTYPE_DYNSTR,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d60,"LIB$SIGNAL",&local_d61);
  InitOneFunction(this,(string *)local_d60,"exit",VARTYPE_LONG,VARCLASS_FUNC);
  std::__cxx11::string::~string(local_d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  return;
}

Assistant:

void VariableList::InitFunctions(void)
{
	InitOneFunction("ABS",		"fabs",			VARTYPE_DOUBLE);
	InitOneFunction("ABS%",		"abs",			VARTYPE_DOUBLE);
	InitOneFunction("ASC",		"basic::Ascii",		VARTYPE_LONG);
	InitOneFunction("ASCII",	"basic::Ascii",		VARTYPE_LONG);
	InitOneFunction("ATN",		"atan",			VARTYPE_DOUBLE);
	InitOneFunction("BUFSIZ",	"basic::Bufsiz",	VARTYPE_LONG);
	InitOneFunction("CCPOS",	"basic::Ccpos",		VARTYPE_LONG);
	InitOneFunction("CHR$",		"basic::Char",		VARTYPE_DYNSTR);
	InitOneFunction("COMP%",	"basic::Comp",		VARTYPE_LONG);
	InitOneFunction("COS",		"cos",			VARTYPE_DOUBLE);
	InitOneFunction("CTRLC",	"basic::ctrlc()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("CVT$%",	"basic::cvtai",		VARTYPE_LONG);
	InitOneFunction("CVT%$",	"basic::cvtia",		VARTYPE_DYNSTR);
	InitOneFunction("CVT$F",	"basic::cvtaf",		VARTYPE_DOUBLE);
	InitOneFunction("CVTF$",	"basic::cvtfa",		VARTYPE_DYNSTR);
	InitOneFunction("CVT$$",	"basic::edit",		VARTYPE_DYNSTR);
	InitOneFunction("DATE$",	"basic::Qdate",		VARTYPE_DYNSTR);
	InitOneFunction("DET",		"basic::det()",		VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("DIF$",		"basic::Dif",		VARTYPE_DYNSTR);
	InitOneFunction("ECHO",		"basic::Echo",		VARTYPE_LONG);
	InitOneFunction("EDIT$",	"basic::edit",		VARTYPE_DYNSTR);
	InitOneFunction("ERR",		"Be.err",		VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("ERL",		"Be.erl",		VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("ERN$",		"Be.ern",		VARTYPE_DYNSTR, VARCLASS_NONE);
	InitOneFunction("ERT$",		"basic::ert",		VARTYPE_DYNSTR);
	InitOneFunction("EXP",		"basic::exp",		VARTYPE_DOUBLE);
	InitOneFunction("FIX",		"trunc",		VARTYPE_DOUBLE);
	InitOneFunction("FORMAT$",	"basic::Format",	VARTYPE_DYNSTR);
	InitOneFunction("FSP$",		"basic::Fsp",		VARTYPE_DYNSTR);
	InitOneFunction("FSS$",		"basic::Fss",		VARTYPE_DYNSTR);
	InitOneFunction("GETRFA",	"basic::Getrfa",	VARTYPE_RFA);
	InitOneFunction("INKEY$",	"basic::Inkey",		VARTYPE_DYNSTR);
	InitOneFunction("INSTR",	"basic::instr",		VARTYPE_LONG);
	InitOneFunction("INT",		"floor",		VARTYPE_DOUBLE);
	InitOneFunction("LEFT",		"basic::left",		VARTYPE_DYNSTR);
	InitOneFunction("LEFT$",	"basic::left",		VARTYPE_DYNSTR);
	InitOneFunction("LEN",		"basic::strlen",	VARTYPE_LONG);
	InitOneFunction("LOC",		"&",			VARTYPE_LONG);
	InitOneFunction("LOG",		"log",			VARTYPE_DOUBLE);
	InitOneFunction("LOG10",	"log10",		VARTYPE_DOUBLE);
	InitOneFunction("MAG",		"basic::Mag",		VARTYPE_DOUBLE);
	InitOneFunction("MAGTAPE",	"basic::Magtape",	VARTYPE_LONG);
	InitOneFunction("MAR",		"basic::Mar",		VARTYPE_LONG);
	InitOneFunction("MID",		"basic::mid",		VARTYPE_DYNSTR);
	InitOneFunction("MID$",		"basic::mid",		VARTYPE_DYNSTR);
	InitOneFunction("NOECHO",	"basic::NoEcho",	VARTYPE_LONG);
	InitOneFunction("NUM",		"basic::num()",		VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("NUM2",		"basic::num2()",	VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("NUM$",		"basic::Qnum",		VARTYPE_DYNSTR);
	InitOneFunction("NUM1$",	"std::to_string",	VARTYPE_DYNSTR);
	InitOneFunction("ONECHR",	"basic::OneChr",	VARTYPE_LONG);
	InitOneFunction("PLACE$",	"basic::Place",		VARTYPE_DYNSTR);
	InitOneFunction("POS",		"basic::Ccpos",		VARTYPE_LONG);
	InitOneFunction("PROD$",	"basic::Prod",		VARTYPE_DYNSTR);
	InitOneFunction("QUO$",		"basic::Quo",		VARTYPE_DYNSTR);
	InitOneFunction("RAD$",		"basic::Qrad",		VARTYPE_DYNSTR);
	InitOneFunction("RCTLC",	"basic::rctlc()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RCTLO",	"basic::rctlo()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RECOUNT",	"basic::recount()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RIGHT",	"basic::right",		VARTYPE_DYNSTR);
	InitOneFunction("RIGHT$",	"basic::right",		VARTYPE_DYNSTR);
	InitOneFunction("RND",		"basic::floatrand",	VARTYPE_DOUBLE);
	InitOneFunction("RND",		"basic::floatrand()",	VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("SEG$",		"basic::Qseg",		VARTYPE_DYNSTR);
	InitOneFunction("SGN",		"basic::sgn",		VARTYPE_LONG);
	InitOneFunction("SIN",		"sin",			VARTYPE_DOUBLE);
	InitOneFunction("SPACE$",	"basic::Qspace",	VARTYPE_DYNSTR);
	InitOneFunction("SQRT",		"sqrt",			VARTYPE_DOUBLE);
	InitOneFunction("SQR",		"sqrt",			VARTYPE_DOUBLE);
	InitOneFunction("STATUS",	"basic::status()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("STR$",		"basic::Qnum",		VARTYPE_DYNSTR);
	InitOneFunction("STRING$",	"basic::Qstring",	VARTYPE_DYNSTR);
	InitOneFunction("STR$FIND_FIRST_IN_SET",
					"str$find_first_in_set",VARTYPE_DYNSTR);
	InitOneFunction("SUM$",		"basic::Sum",		VARTYPE_DYNSTR);
	InitOneFunction("SWAP%",	"basic::Swap",		VARTYPE_LONG);
	InitOneFunction("SYS",		"basic::sys",		VARTYPE_DYNSTR);
	InitOneFunction("TAB",		"Tab",			VARTYPE_DYNSTR);
	InitOneFunction("TAN",		"tan",			VARTYPE_DOUBLE);
	InitOneFunction("TIME",		"basic::Time",		VARTYPE_DOUBLE);
	InitOneFunction("TIME$",	"basic::Qtime",		VARTYPE_DYNSTR);
	InitOneFunction("TRM$",		"boost::trim_right_copy",	VARTYPE_DYNSTR);
	InitOneFunction("VAL",		"std::stod",		VARTYPE_DOUBLE);
	InitOneFunction("VAL%",		"std::stol",		VARTYPE_LONG);
	InitOneFunction("XLATE",	"basic::Xlate",		VARTYPE_DYNSTR);
	InitOneFunction("LIB$SIGNAL",	"exit",			VARTYPE_LONG);
}